

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O3

int loop_restoration_row_worker(void *arg1,void *arg2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  pthread_mutex_t *__mutex;
  int *piVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  code *on_sync_read;
  ulong uVar10;
  ulong uVar11;
  code *on_sync_write;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  AV1LrSync *loop_res_sync;
  RestorationTileLimits local_40;
  
  puVar4 = *(undefined8 **)((long)arg2 + 0x10);
  __mutex = *(pthread_mutex_t **)((long)arg1 + 0x58);
  iVar8 = _setjmp((__jmp_buf_tag *)((long)arg2 + 0xf8));
  if (iVar8 == 0) {
    *(undefined4 *)((long)arg2 + 0xf0) = 1;
    pthread_mutex_lock(*(pthread_mutex_t **)((long)arg1 + 0x58));
    if (*(char *)((long)arg1 + 0x78) == '\0') {
      do {
        iVar8 = *(int *)((long)arg1 + 0x74);
        if (*(int *)((long)arg1 + 0x70) <= iVar8) break;
        lVar9 = *(long *)((long)arg1 + 0x68);
        *(int *)((long)arg1 + 0x74) = iVar8 + 1;
        pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg1 + 0x58));
        if (lVar9 == 0) goto LAB_00b9638d;
        lVar6 = (long)iVar8 * 0x1c;
        local_40._8_8_ = *(undefined8 *)(lVar9 + lVar6);
        iVar8 = *(int *)(lVar9 + 0x10 + lVar6);
        on_sync_read = lr_sync_read;
        if (iVar8 != 1) {
          on_sync_read = av1_lr_sync_read_dummy;
        }
        iVar1 = *(int *)(lVar9 + 0xc + lVar6);
        lVar12 = (long)iVar1;
        iVar2 = *(int *)(puVar4 + lVar12 * 7 + 3);
        on_sync_write = lr_sync_write;
        if (iVar8 != 0) {
          on_sync_write = av1_lr_sync_write_dummy;
        }
        lVar7 = puVar4[lVar12 * 7 + 1];
        av1_foreach_rest_unit_in_row
                  (&local_40,iVar2,(rest_unit_visitor_t)*puVar4,*(int *)(lVar9 + 8 + lVar6),
                   *(int *)(lVar7 + 4),*(int *)(lVar7 + 0x10),*(int *)(lVar7 + 0xc),iVar1,
                   puVar4 + lVar12 * 7 + 1,*arg2,*(RestorationLineBuffers **)((long)arg2 + 8),
                   on_sync_read,on_sync_write,(AV1LrSyncData *)arg1,
                   (aom_internal_error_info *)((long)arg2 + 0x20));
        (*loop_restoration_row_worker::copy_funs[lVar12])
                  ((YV12_BUFFER_CONFIG *)puVar4[0x17],(YV12_BUFFER_CONFIG *)puVar4[0x16],0,iVar2,
                   *(int *)(lVar9 + 0x14 + lVar6),*(int *)(lVar9 + 0x18 + lVar6));
        if (*(int *)((long)arg2 + 0x18) != 0) {
          aom_extend_frame_borders_plane_row_c
                    ((YV12_BUFFER_CONFIG *)puVar4[0x16],iVar1,*(int *)(lVar9 + lVar6 + 0x14),
                     *(int *)(lVar9 + lVar6 + 0x18));
        }
        pthread_mutex_lock(*(pthread_mutex_t **)((long)arg1 + 0x58));
      } while (*(char *)((long)arg1 + 0x78) == '\0');
    }
    pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg1 + 0x58));
LAB_00b9638d:
    *(undefined4 *)((long)arg2 + 0xf0) = 0;
    iVar8 = 1;
  }
  else {
    *(undefined4 *)((long)arg2 + 0xf0) = 0;
    pthread_mutex_lock(__mutex);
    *(undefined1 *)((long)arg1 + 0x78) = 1;
    pthread_mutex_unlock(__mutex);
    lVar9 = 0;
    do {
      piVar5 = (int *)puVar4[lVar9 * 7 + 1];
      if ((*piVar5 != 0) && (iVar8 = *(int *)((long)puVar4 + lVar9 * 0x38 + 0x1c), 0 < iVar8)) {
        iVar1 = piVar5[1];
        iVar2 = piVar5[4];
        uVar10 = 0;
        uVar11 = uVar10;
        uVar13 = uVar10;
        uVar14 = uVar10;
        do {
          iVar16 = iVar8 - (int)uVar10;
          if ((iVar1 * 3) / 2 <= iVar16) {
            iVar16 = iVar1;
          }
          iVar15 = *(int *)((long)arg1 + 0x48) + iVar2;
          pthread_mutex_lock((pthread_mutex_t *)(*(long *)((long)arg1 + lVar9 * 8) + uVar11));
          lVar6 = *(long *)((long)arg1 + lVar9 * 8 + 0x30);
          iVar3 = *(int *)(lVar6 + uVar14);
          if (iVar15 < iVar3) {
            iVar15 = iVar3;
          }
          *(int *)(lVar6 + uVar14) = iVar15;
          pthread_cond_broadcast
                    ((pthread_cond_t *)(*(long *)((long)arg1 + lVar9 * 8 + 0x18) + uVar13));
          pthread_mutex_unlock((pthread_mutex_t *)(*(long *)((long)arg1 + lVar9 * 8) + uVar11));
          uVar17 = iVar16 + (int)uVar10;
          uVar11 = uVar11 + 0x28;
          uVar13 = uVar13 + 0x30;
          uVar14 = uVar14 + 4;
          uVar10 = (ulong)uVar17;
        } while ((int)uVar17 < iVar8);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

static int loop_restoration_row_worker(void *arg1, void *arg2) {
  AV1LrSync *const lr_sync = (AV1LrSync *)arg1;
  LRWorkerData *lrworkerdata = (LRWorkerData *)arg2;
  AV1LrStruct *lr_ctxt = (AV1LrStruct *)lrworkerdata->lr_ctxt;
  FilterFrameCtxt *ctxt = lr_ctxt->ctxt;
  int lr_unit_row;
  int plane;
  int plane_w;
#if CONFIG_MULTITHREAD
  pthread_mutex_t *job_mutex_ = lr_sync->job_mutex;
#endif
  struct aom_internal_error_info *const error_info = &lrworkerdata->error_info;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(job_mutex_);
    lr_sync->lr_mt_exit = true;
    pthread_mutex_unlock(job_mutex_);
#endif
    // In case of loop restoration multithreading, the worker on an even lr
    // block row waits for the completion of the filtering of the top-right and
    // bottom-right blocks. Hence, in case a thread (main/worker) encounters an
    // error, update that filtering of every row in the frame is complete in
    // order to avoid the dependent workers from waiting indefinitely.
    set_loop_restoration_done(lr_sync, lr_ctxt->ctxt);
    return 0;
  }
  error_info->setjmp = 1;

  typedef void (*copy_fun)(const YV12_BUFFER_CONFIG *src_ybc,
                           YV12_BUFFER_CONFIG *dst_ybc, int hstart, int hend,
                           int vstart, int vend);
  static const copy_fun copy_funs[MAX_MB_PLANE] = {
    aom_yv12_partial_coloc_copy_y, aom_yv12_partial_coloc_copy_u,
    aom_yv12_partial_coloc_copy_v
  };

  while (1) {
    AV1LrMTInfo *cur_job_info = get_lr_job_info(lr_sync);
    if (cur_job_info != NULL) {
      RestorationTileLimits limits;
      sync_read_fn_t on_sync_read;
      sync_write_fn_t on_sync_write;
      limits.v_start = cur_job_info->v_start;
      limits.v_end = cur_job_info->v_end;
      lr_unit_row = cur_job_info->lr_unit_row;
      plane = cur_job_info->plane;
      plane_w = ctxt[plane].plane_w;

      // sync_mode == 1 implies only sync read is required in LR Multi-threading
      // sync_mode == 0 implies only sync write is required.
      on_sync_read =
          cur_job_info->sync_mode == 1 ? lr_sync_read : av1_lr_sync_read_dummy;
      on_sync_write = cur_job_info->sync_mode == 0 ? lr_sync_write
                                                   : av1_lr_sync_write_dummy;

      av1_foreach_rest_unit_in_row(
          &limits, plane_w, lr_ctxt->on_rest_unit, lr_unit_row,
          ctxt[plane].rsi->restoration_unit_size, ctxt[plane].rsi->horz_units,
          ctxt[plane].rsi->vert_units, plane, &ctxt[plane],
          lrworkerdata->rst_tmpbuf, lrworkerdata->rlbs, on_sync_read,
          on_sync_write, lr_sync, error_info);

      copy_funs[plane](lr_ctxt->dst, lr_ctxt->frame, 0, plane_w,
                       cur_job_info->v_copy_start, cur_job_info->v_copy_end);

      if (lrworkerdata->do_extend_border) {
        aom_extend_frame_borders_plane_row(lr_ctxt->frame, plane,
                                           cur_job_info->v_copy_start,
                                           cur_job_info->v_copy_end);
      }
    } else {
      break;
    }
  }
  error_info->setjmp = 0;
  return 1;
}